

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeBase *
CheckPreviousTypeDefinition
          (ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx,char *symbols,
          ExternTypeInfo *type,TypeClass **forwardDeclaration)

{
  bool bVar1;
  TypeBase *node;
  TypeClass *pTVar2;
  bool local_51;
  bool duplicate;
  TypeClass *prevTypeClass;
  TypeBase *prevType;
  TypeClass **forwardDeclaration_local;
  ExternTypeInfo *type_local;
  char *symbols_local;
  ModuleContext *moduleCtx_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  node = anon_unknown.dwarf_e7629::LookupTypeByName(ctx,type->nameHash);
  if (node != (TypeBase *)0x0) {
    pTVar2 = getType<TypeClass>(node);
    if (((type->definitionModule == 0) && (node->importModule != (ModuleData *)0x0)) &&
       (moduleCtx->data->bytecode != node->importModule->bytecode)) {
      local_51 = isType<TypeGenericClassProto>(node);
      if (((pTVar2 != (TypeClass *)0x0) &&
          (bVar1 = IntrusiveList<MatchData>::empty(&pTVar2->generics), bVar1)) &&
         (((pTVar2->completed & 1U) != 0 && ((type->typeFlags & 0x10) != 0)))) {
        local_51 = true;
      }
      if (local_51 != false) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,source,
                   "ERROR: type \'%s\' in module \'%.*s\' is already defined in module \'%.*s\'",
                   symbols + type->offsetToName,
                   (ulong)(uint)((int)(moduleCtx->data->name).end -
                                (int)(moduleCtx->data->name).begin),(moduleCtx->data->name).begin,
                   (int)(node->importModule->name).end - (int)(node->importModule->name).begin,
                   (node->importModule->name).begin);
      }
    }
    if (pTVar2 == (TypeClass *)0x0) {
      return node;
    }
    if ((pTVar2->completed & 1U) != 0) {
      return node;
    }
    if ((type->typeFlags & 0x10) == 0) {
      return node;
    }
    if (forwardDeclaration != (TypeClass **)0x0) {
      *forwardDeclaration = pTVar2;
    }
  }
  return (TypeBase *)0x0;
}

Assistant:

TypeBase* CheckPreviousTypeDefinition(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx, char *symbols, ExternTypeInfo &type, TypeClass **forwardDeclaration)
{
	if(TypeBase *prevType = LookupTypeByName(ctx, type.nameHash))
	{
		TypeClass *prevTypeClass = getType<TypeClass>(prevType);

		if(type.definitionModule == 0 && prevType->importModule && moduleCtx.data->bytecode != prevType->importModule->bytecode)
		{
			bool duplicate = isType<TypeGenericClassProto>(prevType);

			if(prevTypeClass && prevTypeClass->generics.empty() && prevTypeClass->completed && (type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED) != 0)
				duplicate = true;

			if(duplicate)
				Stop(ctx, source, "ERROR: type '%s' in module '%.*s' is already defined in module '%.*s'", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name), FMT_ISTR(prevType->importModule->name));
		}

		if(prevTypeClass && !prevTypeClass->completed && (type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED) != 0)
		{
			if(forwardDeclaration)
				*forwardDeclaration = prevTypeClass;
		}
		else
		{
			return prevType;
		}
	}

	return NULL;
}